

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int loadStatTbl(sqlite3 *db,int bStat3,char *zSql1,char *zSql2,char *zDb)

{
  int iVar1;
  long lVar2;
  ushort uVar3;
  int iVar4;
  char *pcVar5;
  uchar *puVar6;
  Mem *pMVar7;
  i64 iVar8;
  Index *pIVar9;
  IndexSample *pIVar10;
  Index *pIVar11;
  void *__dest;
  void *__src;
  tRowcnt **pptVar12;
  tRowcnt *ptVar13;
  uint uVar14;
  ulong uVar15;
  void **ppvVar16;
  void **ppvVar17;
  sqlite3_stmt *psVar18;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_50;
  sqlite3_stmt *local_48;
  Index *local_40;
  Index *local_38;
  
  local_50 = (sqlite3_stmt *)0x0;
  pcVar5 = sqlite3MPrintf(db,zSql1,zDb);
  iVar4 = 7;
  if (pcVar5 != (char *)0x0) {
    iVar4 = sqlite3LockAndPrepare(db,pcVar5,-1,0,(Vdbe *)0x0,&local_50,(char **)0x0);
    sqlite3DbFreeNN(db,pcVar5);
    psVar18 = local_50;
    if (iVar4 == 0) {
      while (iVar4 = sqlite3_step(psVar18), iVar4 == 100) {
        puVar6 = sqlite3_column_text(psVar18,0);
        if (puVar6 != (uchar *)0x0) {
          pMVar7 = columnMem(psVar18,1);
          iVar8 = sqlite3VdbeIntValue(pMVar7);
          columnMallocFailure(psVar18);
          pIVar9 = findIndexOrPrimaryKey(db,(char *)puVar6,zDb);
          if ((pIVar9 != (Index *)0x0) && (pIVar9->nSample == 0)) {
            uVar3 = 1;
            if (bStat3 == 0) {
              if (((pIVar9->pTable->tabFlags & 0x20) == 0) ||
                 ((*(ushort *)&pIVar9->field_0x63 & 3) != 2)) {
                uVar3 = pIVar9->nColumn;
              }
              else {
                uVar3 = pIVar9->nKeyCol;
              }
            }
            pIVar9->nSampleCol = (uint)uVar3;
            uVar14 = (uint)iVar8;
            pIVar10 = (IndexSample *)
                      sqlite3DbMallocZero(db,(long)(int)((((uint)uVar3 + (uint)uVar3 * 2) * 4 + 0x28
                                                         ) * uVar14 + (uint)uVar3 * 4));
            pIVar9->aSample = pIVar10;
            if (pIVar10 == (IndexSample *)0x0) {
              sqlite3_finalize(psVar18);
              goto LAB_00153ec6;
            }
            pIVar9->aAvgEq = (tRowcnt *)(pIVar10 + (int)uVar14);
            if (0 < (int)uVar14) {
              uVar15 = (ulong)(uVar14 & 0x7fffffff);
              pptVar12 = &pIVar10->anDLt;
              ptVar13 = (tRowcnt *)((long)&pIVar10[(int)uVar14].p + (ulong)((uint)uVar3 * 4));
              lVar2 = (ulong)((uint)uVar3 * 4) * 3;
              ppvVar16 = &pIVar10[(int)uVar14].p;
              ppvVar17 = &pIVar10[(int)uVar14].p + uVar3;
              do {
                ppvVar16 = (void **)((long)ppvVar16 + lVar2);
                pptVar12[-2] = ptVar13;
                pptVar12[-1] = (tRowcnt *)ppvVar17;
                *pptVar12 = (tRowcnt *)ppvVar16;
                pptVar12 = pptVar12 + 5;
                ptVar13 = (tRowcnt *)((long)ptVar13 + lVar2);
                ppvVar17 = (void **)((long)ppvVar17 + lVar2);
                uVar15 = uVar15 - 1;
              } while (uVar15 != 0);
            }
          }
        }
      }
      iVar4 = sqlite3_finalize(psVar18);
      if (iVar4 == 0) {
        pcVar5 = sqlite3MPrintf(db,zSql2,zDb);
        if (pcVar5 == (char *)0x0) {
LAB_00153ec6:
          iVar4 = 7;
        }
        else {
          iVar4 = sqlite3LockAndPrepare(db,pcVar5,-1,0,(Vdbe *)0x0,&local_50,(char **)0x0);
          sqlite3DbFreeNN(db,pcVar5);
          psVar18 = local_50;
          if (iVar4 == 0) {
            iVar4 = sqlite3_step(local_50);
            pIVar9 = (Index *)0x0;
            if (iVar4 == 100) {
              local_48 = psVar18;
              do {
                puVar6 = sqlite3_column_text(psVar18,0);
                if (((puVar6 != (uchar *)0x0) &&
                    (pIVar11 = findIndexOrPrimaryKey(db,(char *)puVar6,zDb), pIVar11 != (Index *)0x0
                    )) && ((iVar4 = pIVar11->nSampleCol, bStat3 == 0 || (iVar4 < 2)))) {
                  local_38 = pIVar11;
                  if (pIVar11 != pIVar9) {
                    initAvgEq(pIVar9);
                    local_40 = local_38;
                    pIVar9 = local_40;
                  }
                  local_40 = pIVar9;
                  psVar18 = local_48;
                  pIVar10 = local_38->aSample;
                  iVar1 = local_38->nSample;
                  puVar6 = sqlite3_column_text(local_48,1);
                  decodeIntArray((char *)puVar6,iVar4,pIVar10[iVar1].anEq,(LogEst *)0x0,(Index *)0x0
                                );
                  puVar6 = sqlite3_column_text(psVar18,2);
                  decodeIntArray((char *)puVar6,iVar4,pIVar10[iVar1].anLt,(LogEst *)0x0,(Index *)0x0
                                );
                  puVar6 = sqlite3_column_text(psVar18,3);
                  decodeIntArray((char *)puVar6,iVar4,pIVar10[iVar1].anDLt,(LogEst *)0x0,
                                 (Index *)0x0);
                  iVar4 = sqlite3_column_bytes(psVar18,4);
                  pIVar10[iVar1].n = iVar4;
                  __dest = sqlite3DbMallocZero(db,(long)(iVar4 + 2));
                  psVar18 = local_48;
                  pIVar10[iVar1].p = __dest;
                  if (__dest == (void *)0x0) {
                    sqlite3_finalize(local_48);
                    return 7;
                  }
                  if (pIVar10[iVar1].n != 0) {
                    pMVar7 = columnMem(local_48,4);
                    __src = sqlite3_value_blob(pMVar7);
                    columnMallocFailure(psVar18);
                    memcpy(__dest,__src,(long)pIVar10[iVar1].n);
                  }
                  local_38->nSample = local_38->nSample + 1;
                  pIVar9 = local_40;
                }
                iVar4 = sqlite3_step(psVar18);
              } while (iVar4 == 100);
            }
            iVar4 = sqlite3_finalize(psVar18);
            if (iVar4 == 0) {
              initAvgEq(pIVar9);
              iVar4 = 0;
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int loadStatTbl(
  sqlite3 *db,                  /* Database handle */
  int bStat3,                   /* Assume single column records only */
  const char *zSql1,            /* SQL statement 1 (see above) */
  const char *zSql2,            /* SQL statement 2 (see above) */
  const char *zDb               /* Database name (e.g. "main") */
){
  int rc;                       /* Result codes from subroutines */
  sqlite3_stmt *pStmt = 0;      /* An SQL statement being run */
  char *zSql;                   /* Text of the SQL statement */
  Index *pPrevIdx = 0;          /* Previous index in the loop */
  IndexSample *pSample;         /* A slot in pIdx->aSample[] */

  assert( db->lookaside.bDisable );
  zSql = sqlite3MPrintf(db, zSql1, zDb);
  if( !zSql ){
    return SQLITE_NOMEM_BKPT;
  }
  rc = sqlite3_prepare(db, zSql, -1, &pStmt, 0);
  sqlite3DbFree(db, zSql);
  if( rc ) return rc;

  while( sqlite3_step(pStmt)==SQLITE_ROW ){
    int nIdxCol = 1;              /* Number of columns in stat4 records */

    char *zIndex;   /* Index name */
    Index *pIdx;    /* Pointer to the index object */
    int nSample;    /* Number of samples */
    int nByte;      /* Bytes of space required */
    int i;          /* Bytes of space required */
    tRowcnt *pSpace;

    zIndex = (char *)sqlite3_column_text(pStmt, 0);
    if( zIndex==0 ) continue;
    nSample = sqlite3_column_int(pStmt, 1);
    pIdx = findIndexOrPrimaryKey(db, zIndex, zDb);
    assert( pIdx==0 || bStat3 || pIdx->nSample==0 );
    /* Index.nSample is non-zero at this point if data has already been
    ** loaded from the stat4 table. In this case ignore stat3 data.  */
    if( pIdx==0 || pIdx->nSample ) continue;
    if( bStat3==0 ){
      assert( !HasRowid(pIdx->pTable) || pIdx->nColumn==pIdx->nKeyCol+1 );
      if( !HasRowid(pIdx->pTable) && IsPrimaryKeyIndex(pIdx) ){
        nIdxCol = pIdx->nKeyCol;
      }else{
        nIdxCol = pIdx->nColumn;
      }
    }
    pIdx->nSampleCol = nIdxCol;
    nByte = sizeof(IndexSample) * nSample;
    nByte += sizeof(tRowcnt) * nIdxCol * 3 * nSample;
    nByte += nIdxCol * sizeof(tRowcnt);     /* Space for Index.aAvgEq[] */

    pIdx->aSample = sqlite3DbMallocZero(db, nByte);
    if( pIdx->aSample==0 ){
      sqlite3_finalize(pStmt);
      return SQLITE_NOMEM_BKPT;
    }
    pSpace = (tRowcnt*)&pIdx->aSample[nSample];
    pIdx->aAvgEq = pSpace; pSpace += nIdxCol;
    for(i=0; i<nSample; i++){
      pIdx->aSample[i].anEq = pSpace; pSpace += nIdxCol;
      pIdx->aSample[i].anLt = pSpace; pSpace += nIdxCol;
      pIdx->aSample[i].anDLt = pSpace; pSpace += nIdxCol;
    }
    assert( ((u8*)pSpace)-nByte==(u8*)(pIdx->aSample) );
  }
  rc = sqlite3_finalize(pStmt);
  if( rc ) return rc;

  zSql = sqlite3MPrintf(db, zSql2, zDb);
  if( !zSql ){
    return SQLITE_NOMEM_BKPT;
  }
  rc = sqlite3_prepare(db, zSql, -1, &pStmt, 0);
  sqlite3DbFree(db, zSql);
  if( rc ) return rc;

  while( sqlite3_step(pStmt)==SQLITE_ROW ){
    char *zIndex;                 /* Index name */
    Index *pIdx;                  /* Pointer to the index object */
    int nCol = 1;                 /* Number of columns in index */

    zIndex = (char *)sqlite3_column_text(pStmt, 0);
    if( zIndex==0 ) continue;
    pIdx = findIndexOrPrimaryKey(db, zIndex, zDb);
    if( pIdx==0 ) continue;
    /* This next condition is true if data has already been loaded from 
    ** the sqlite_stat4 table. In this case ignore stat3 data.  */
    nCol = pIdx->nSampleCol;
    if( bStat3 && nCol>1 ) continue;
    if( pIdx!=pPrevIdx ){
      initAvgEq(pPrevIdx);
      pPrevIdx = pIdx;
    }
    pSample = &pIdx->aSample[pIdx->nSample];
    decodeIntArray((char*)sqlite3_column_text(pStmt,1),nCol,pSample->anEq,0,0);
    decodeIntArray((char*)sqlite3_column_text(pStmt,2),nCol,pSample->anLt,0,0);
    decodeIntArray((char*)sqlite3_column_text(pStmt,3),nCol,pSample->anDLt,0,0);

    /* Take a copy of the sample. Add two 0x00 bytes the end of the buffer.
    ** This is in case the sample record is corrupted. In that case, the
    ** sqlite3VdbeRecordCompare() may read up to two varints past the
    ** end of the allocated buffer before it realizes it is dealing with
    ** a corrupt record. Adding the two 0x00 bytes prevents this from causing
    ** a buffer overread.  */
    pSample->n = sqlite3_column_bytes(pStmt, 4);
    pSample->p = sqlite3DbMallocZero(db, pSample->n + 2);
    if( pSample->p==0 ){
      sqlite3_finalize(pStmt);
      return SQLITE_NOMEM_BKPT;
    }
    if( pSample->n ){
      memcpy(pSample->p, sqlite3_column_blob(pStmt, 4), pSample->n);
    }
    pIdx->nSample++;
  }
  rc = sqlite3_finalize(pStmt);
  if( rc==SQLITE_OK ) initAvgEq(pPrevIdx);
  return rc;
}